

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zetMetricDecoderDestroyExp(zet_metric_decoder_exp_handle_t phMetricDecoder)

{
  zet_pfnMetricDecoderDestroyExp_t pfnDestroyExp;
  dditable_t *dditable;
  ze_result_t result;
  zet_metric_decoder_exp_handle_t phMetricDecoder_local;
  
  if (*(code **)(*(long *)(phMetricDecoder + 8) + 0x6b0) == (code *)0x0) {
    phMetricDecoder_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    phMetricDecoder_local._4_4_ =
         (**(code **)(*(long *)(phMetricDecoder + 8) + 0x6b0))(*(undefined8 *)phMetricDecoder);
  }
  return phMetricDecoder_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDecoderDestroyExp(
        zet_metric_decoder_exp_handle_t phMetricDecoder ///< [in] handle of the metric decoder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_decoder_exp_object_t*>( phMetricDecoder )->dditable;
        auto pfnDestroyExp = dditable->zet.MetricDecoderExp.pfnDestroyExp;
        if( nullptr == pfnDestroyExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        phMetricDecoder = reinterpret_cast<zet_metric_decoder_exp_object_t*>( phMetricDecoder )->handle;

        // forward to device-driver
        result = pfnDestroyExp( phMetricDecoder );

        return result;
    }